

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TAPReporter::assertionEnded(TAPReporter *this,AssertionStats *_assertionStats)

{
  ostream *poVar1;
  ColourImpl *in_RSI;
  AssertionStats *in_RDI;
  TapAssertionPrinter printer;
  TapAssertionPrinter *in_stack_000000c0;
  pointer _counter;
  ostream *in_stack_ffffffffffffffb8;
  TapAssertionPrinter *in_stack_ffffffffffffffc0;
  
  (in_RDI->infoMessages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&(((in_RDI->infoMessages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->macroName).m_start + 1);
  poVar1 = std::operator<<((ostream *)(in_RDI->assertionResult).m_info.capturedExpression.m_start,
                           "# ");
  poVar1 = std::operator<<(poVar1,*(string **)
                                   ((long)&(in_RDI->assertionResult).m_resultData.
                                           reconstructedExpression.field_2 + 8));
  std::operator<<(poVar1,'\n');
  _counter = (in_RDI->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
  Detail::unique_ptr<Catch::ColourImpl>::get
            ((unique_ptr<Catch::ColourImpl> *)
             &(in_RDI->assertionResult).m_info.capturedExpression.m_size);
  anon_unknown_26::TapAssertionPrinter::TapAssertionPrinter
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,(size_t)_counter,in_RSI);
  anon_unknown_26::TapAssertionPrinter::print(in_stack_000000c0);
  poVar1 = std::operator<<((ostream *)(in_RDI->assertionResult).m_info.capturedExpression.m_start,
                           '\n');
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void TAPReporter::assertionEnded(AssertionStats const& _assertionStats) {
        ++counter;

        m_stream << "# " << currentTestCaseInfo->name << '\n';
        TapAssertionPrinter printer(m_stream, _assertionStats, counter, m_colour.get());
        printer.print();

        m_stream << '\n' << std::flush;
    }